

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryPow<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::fastAccessDx
          (FadBinaryPow<Fad<Fad<double>_>,_Fad<Fad<double>_>_> *this,int i)

{
  Fad<Fad<double>_> *this_00;
  undefined8 *in_RSI;
  value_type *in_RDI;
  undefined8 in_stack_ffffffffffffff18;
  int i_00;
  Fad<Fad<double>_> *in_stack_ffffffffffffff20;
  Fad<double> *in_stack_ffffffffffffff50;
  Fad<double> *in_stack_ffffffffffffff58;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncLog<Fad<double>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>_>_>
  *in_stack_ffffffffffffff68;
  Fad<double> *in_stack_ffffffffffffff70;
  
  i_00 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  Fad<Fad<double>_>::fastAccessDx(in_stack_ffffffffffffff20,i_00);
  Fad<Fad<double>_>::val((Fad<Fad<double>_> *)*in_RSI);
  log<double>(in_stack_ffffffffffffff58);
  operator*<Fad<double>,_FadExpr<FadFuncLog<Fad<double>_>_>,_nullptr>
            (in_stack_ffffffffffffff58,
             (FadExpr<FadFuncLog<Fad<double>_>_> *)in_stack_ffffffffffffff50);
  this_00 = (Fad<Fad<double>_> *)Fad<Fad<double>_>::val((Fad<Fad<double>_> *)in_RSI[1]);
  Fad<Fad<double>_>::fastAccessDx(this_00,i_00);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  Fad<Fad<double>_>::val((Fad<Fad<double>_> *)*in_RSI);
  operator/<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff50);
  operator+<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncLog<Fad<double>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncLog<Fad<double>_>_>_>_> *)
             in_stack_ffffffffffffff58,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffff50);
  Fad<Fad<double>_>::val((Fad<Fad<double>_> *)*in_RSI);
  Fad<Fad<double>_>::val((Fad<Fad<double>_> *)in_RSI[1]);
  pow<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  operator*<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncLog<Fad<double>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncLog<Fad<double>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffff58,
             (FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffff50);
  Fad<double>::
  Fad<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,FadExpr<FadFuncLog<Fad<double>>>>>,FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryPow<Fad<double>,Fad<double>>>>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncLog<Fad<double>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncLog<Fad<double>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>_>_>
              *)this_00);
  FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_> *)this_00);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncLog<Fad<double>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncLog<Fad<double>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)this_00);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)this_00);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)this_00);
  FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncLog<Fad<double>_>_>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncLog<Fad<double>_>_>_>_> *)this_00);
  FadExpr<FadFuncLog<Fad<double>_>_>::~FadExpr((FadExpr<FadFuncLog<Fad<double>_>_> *)this_00);
  return in_RDI;
}

Assistant:

value_type fastAccessDx(int i) const 
    {
      return  (right_.fastAccessDx(i)*log(left_.val())+right_.val()*left_.fastAccessDx(i)/left_.val())
	*pow( left_.val(), right_.val() );
    }